

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue.hpp
# Opt level: O0

type __thiscall
libtorrent::heterogeneous_queue<libtorrent::alert>::
emplace_back<libtorrent::torrent_error_alert,libtorrent::aux::stack_allocator&,libtorrent::torrent_handle,boost::system::error_code&,char_const(&)[12]>
          (heterogeneous_queue<libtorrent::alert> *this,stack_allocator *args,torrent_handle *args_1
          ,error_code *args_2,char (*args_3) [12])

{
  size_t this_00;
  char (*e) [12];
  error_code *h;
  torrent_handle *alloc;
  pointer pcVar1;
  size_t sVar2;
  string_view local_60;
  torrent_error_alert *ret;
  header_t *hdr;
  size_t pad_bytes;
  char *ptr;
  char (*args_local_3) [12];
  error_code *args_local_2;
  torrent_handle *args_local_1;
  stack_allocator *args_local;
  heterogeneous_queue<libtorrent::alert> *this_local;
  
  ptr = *args_3;
  args_local_3 = (char (*) [12])args_2;
  args_local_2 = (error_code *)args_1;
  args_local_1 = (torrent_handle *)args;
  args_local = (stack_allocator *)this;
  if ((ulong)(long)this->m_capacity < (long)this->m_size + 0x60U) {
    grow_capacity(this,0x60);
  }
  pcVar1 = ::std::unique_ptr<char,_libtorrent::aux::free_deleter>::get(&this->m_storage);
  pad_bytes = (size_t)(pcVar1 + this->m_size);
  hdr = (header_t *)libtorrent::aux::calculate_pad_bytes((char *)(pad_bytes + 0x10),8);
  ret = (torrent_error_alert *)pad_bytes;
  *(char *)(pad_bytes + 2) = (char)hdr;
  *(code **)(pad_bytes + 8) = move<libtorrent::torrent_error_alert>;
  pad_bytes = (long)&hdr[1].len + pad_bytes;
  sVar2 = libtorrent::aux::calculate_pad_bytes((char *)(pad_bytes + 0x48),8);
  alloc = args_local_1;
  h = args_local_2;
  e = args_local_3;
  this_00 = pad_bytes;
  *(short *)&(ret->super_torrent_alert).super_alert._vptr_alert = (short)sVar2 + 0x48;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,ptr);
  torrent_error_alert::torrent_error_alert
            ((torrent_error_alert *)this_00,(stack_allocator *)alloc,(torrent_handle *)h,
             (error_code *)e,local_60);
  this->m_num_items = this->m_num_items + 1;
  this->m_size = (int)hdr + 0x10 +
                 (uint)*(ushort *)&(ret->super_torrent_alert).super_alert._vptr_alert + this->m_size
  ;
  return (type)this_00;
}

Assistant:

typename std::enable_if<std::is_base_of<T, U>::value, U&>::type
		emplace_back(Args&&... args)
		{
			// make the conservative assumption that we'll need the maximum padding
			// for this object, just for purposes of growing the storage
			if (std::size_t(m_size) + sizeof(header_t) + alignof(U) + sizeof(U) > std::size_t(m_capacity))
				grow_capacity(sizeof(header_t) + alignof(U) + sizeof(U));

			char* ptr = m_storage.get() + m_size;

			std::size_t const pad_bytes = aux::calculate_pad_bytes(ptr + sizeof(header_t), alignof(U));

			// pad_bytes is only 8 bits in the header, so types that need more than
			// 256 byte alignment may not be supported
			static_assert(alignof(U) <= 256
				, "heterogeneous_queue does not support types with alignment requirements > 256");

#ifdef TORRENT_ADDRESS_SANITIZER
			std::size_t const hdr_len = sizeof(U)
				+ aux::calculate_pad_bytes(ptr + sizeof(header_t) + pad_bytes + sizeof(U)
					, alignof(header_t));

			int const new_size = m_size + int(sizeof(header_t) + pad_bytes + hdr_len);

			__sanitizer_annotate_contiguous_container(
				m_storage.get()
				, m_storage.get() + m_capacity
				, ptr
				, m_storage.get() + new_size);
#endif

			// if this assert triggers, the type being added to the queue has
			// alignment requirements stricter than what malloc() returns. This is
			// not supported
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(m_storage.get())
				& (alignof(U) - 1)) == 0);

			// make sure the current position in the storage is aligned for
			// creating a heder_t object
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(ptr)
				& (alignof(header_t) - 1)) == 0);

			// length prefix
			header_t* hdr = new (ptr) header_t;
			hdr->pad_bytes = static_cast<std::uint8_t>(pad_bytes);
			hdr->move = &move<U>;
			ptr += sizeof(header_t) + pad_bytes;
			hdr->len = static_cast<std::uint16_t>(sizeof(U)
				+ aux::calculate_pad_bytes(ptr + sizeof(U), alignof(header_t)));

			// make sure ptr is correctly aligned for the object we're about to
			// create there
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(ptr)
				& (alignof(U) - 1)) == 0);

			// construct in-place
			U* const ret = new (ptr) U(std::forward<Args>(args)...);

			// if we constructed the object without throwing any exception
			// update counters to indicate the new item is in there
			++m_num_items;
			m_size += int(sizeof(header_t) + pad_bytes + hdr->len);
#ifdef TORRENT_ADDRESS_SANITIZER
			TORRENT_ASSERT(m_size == new_size);
#endif
			return *ret;
		}